

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrXMLWrapper.h
# Opt level: O0

ssize_t __thiscall
Assimp::CIrrXML_IOStreamReader::read
          (CIrrXML_IOStreamReader *this,int __fd,void *__buf,size_t __nbytes)

{
  size_t sVar1;
  size_type sVar2;
  reference pvVar3;
  undefined4 in_register_00000034;
  uint local_24;
  int sizeToRead_local;
  void *buffer_local;
  CIrrXML_IOStreamReader *this_local;
  
  local_24 = (uint)__buf;
  if ((int)local_24 < 0) {
    this_local._4_4_ = 0;
  }
  else {
    sVar1 = this->t;
    sVar2 = std::vector<char,_std::allocator<char>_>::size(&this->data);
    if (sVar2 < sVar1 + (long)(int)local_24) {
      sVar2 = std::vector<char,_std::allocator<char>_>::size(&this->data);
      local_24 = (int)sVar2 - (int)this->t;
    }
    pvVar3 = std::vector<char,_std::allocator<char>_>::front(&this->data);
    memcpy((void *)CONCAT44(in_register_00000034,__fd),pvVar3 + this->t,(long)(int)local_24);
    this->t = (long)(int)local_24 + this->t;
    this_local._4_4_ = local_24;
  }
  return (ulong)this_local._4_4_;
}

Assistant:

virtual int read(void* buffer, int sizeToRead)  {
        if(sizeToRead<0) {
            return 0;
        }
        if(t+sizeToRead>data.size()) {
            sizeToRead = static_cast<int>(data.size()-t);
        }

        memcpy(buffer,&data.front()+t,sizeToRead);

        t += sizeToRead;
        return sizeToRead;
    }